

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O2

void __thiscall
embree::OBJLoader::OBJLoader
          (OBJLoader *this,FileName *fileName,bool subdivMode,bool combineIntoSingleObject)

{
  FileName *__return_storage_ptr__;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *this_00;
  vector<embree::Crease,_std::allocator<embree::Crease>_> *this_01;
  vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  *this_02;
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  *this_03;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
  *this_04;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  char cVar5;
  MaterialNode *pMVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  size_type sVar9;
  avector<Vec3fa> *paVar10;
  _Alloc_hider _Var11;
  char cVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  GroupNode *this_05;
  size_t sVar16;
  char *pcVar17;
  iterator iVar18;
  mapped_type *pmVar19;
  Vec3fa *pVVar20;
  long lVar21;
  Vec3fa *pVVar22;
  runtime_error *this_06;
  ulong uVar23;
  ulong uVar24;
  OBJMaterial *pOVar25;
  size_t sVar26;
  char *pcVar27;
  string *__k;
  undefined8 uVar28;
  uint i_2;
  ulong uVar29;
  ulong uVar30;
  float fVar31;
  float fVar32;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar33;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar34;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar35;
  float fVar36;
  char *local_378;
  OBJMaterial *local_370;
  string next_line;
  allocator local_339;
  undefined1 local_338 [24];
  OBJLoader *local_320;
  string *local_318;
  size_t *local_310;
  string line;
  Vertex local_288;
  float local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  string local_258;
  ifstream cin;
  
  this_05 = (GroupNode *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_05,0);
  (this->group).ptr = this_05;
  (*(this_05->super_Node).super_RefCount._vptr_RefCount[2])(this_05);
  __return_storage_ptr__ = &this->path;
  FileName::path(__return_storage_ptr__,fileName);
  this->subdivMode = subdivMode;
  local_310 = &(this->v).size_active;
  paVar10 = &this->vn;
  this_00 = &this->vt;
  this_01 = &this->ec;
  this_02 = &this->curGroup;
  this_03 = &this->curGroupHair;
  local_318 = (string *)&this->curMaterialName;
  (this->v).items = (Vec3fa *)0x0;
  (this->v).size_active = 0;
  (this->v).size_alloced = 0;
  (this->vn).size_active = 0;
  (this->vn).size_alloced = 0;
  (this->vn).items = (Vec3fa *)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vt).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ec).super__Vector_base<embree::Crease,_std::allocator<embree::Crease>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroup).
  super__Vector_base<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->curGroupHair).
  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->curMaterialName)._M_dataplus._M_p = (pointer)&(this->curMaterialName).field_2;
  (this->curMaterialName)._M_string_length = 0;
  (this->curMaterialName).field_2._M_local_buf[0] = '\0';
  (this->curMaterial).ptr = (MaterialNode *)0x0;
  this_04 = &this->material;
  p_Var1 = &(this->material)._M_t._M_impl.super__Rb_tree_header;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->material)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::ifstream::ifstream(&cin);
  std::ifstream::open((char *)&cin,(_Ios_Openmode)(fileName->filename)._M_dataplus._M_p);
  cVar12 = std::__basic_file<char>::is_open();
  local_320 = this;
  if (cVar12 == '\0') {
    this_06 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&next_line,(string *)fileName);
    std::operator+(&line,"cannot open ",&next_line);
    std::runtime_error::runtime_error(this_06,(string *)&line);
    __cxa_throw(this_06,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_370 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
  std::__cxx11::string::string((string *)&local_258,"default",(allocator *)&line);
  pOVar25 = local_370;
  OBJMaterial::OBJMaterial(local_370,&local_258);
  (*(pOVar25->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar25);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::assign((char *)local_318);
  (*(pOVar25->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar25);
  pMVar6 = (this->curMaterial).ptr;
  if (pMVar6 != (MaterialNode *)0x0) {
    (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  (this->curMaterial).ptr = &pOVar25->super_MaterialNode;
  do {
    iVar13 = std::istream::peek();
    if (iVar13 == -1) {
      flushFaceGroup(this);
      std::ifstream::close();
      (*(pOVar25->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[3])(pOVar25);
      std::ifstream::~ifstream(&cin);
      return;
    }
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&cin,(string *)&line);
    while( true ) {
      if ((line._M_string_length == 0) || (line._M_dataplus._M_p[line._M_string_length - 1] != '\\')
         ) goto LAB_00137640;
      line._M_dataplus._M_p[line._M_string_length - 1] = ' ';
      next_line._M_string_length._0_4_ = 0.0;
      next_line._M_string_length._4_4_ = 0;
      next_line.field_2._M_allocated_capacity =
           next_line.field_2._M_allocated_capacity & 0xffffffffffffff00;
      next_line._M_dataplus._M_p = (pointer)&next_line.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&cin,(string *)&next_line);
      if (CONCAT44(next_line._M_string_length._4_4_,(float)next_line._M_string_length) == 0) break;
      std::__cxx11::string::append((string *)&line);
      std::__cxx11::string::~string((string *)&next_line);
    }
    std::__cxx11::string::~string((string *)&next_line);
LAB_00137640:
    _Var11._M_p = line._M_dataplus._M_p;
    sVar16 = strspn(line._M_dataplus._M_p," \t");
    pcVar17 = _Var11._M_p + sVar16;
    trimEnd(pcVar17);
    cVar12 = _Var11._M_p[sVar16];
    if (cVar12 == '\0') goto LAB_00137e98;
    if (cVar12 == 'f') {
      if ((pcVar17[1] == ' ') || (pcVar17[1] == '\t')) {
        local_378 = pcVar17 + 1;
        parseSep(&local_378);
        next_line._M_dataplus._M_p._0_4_ = 0;
        next_line._M_dataplus._M_p._4_4_ = 0.0;
        next_line._M_string_length._0_4_ = 0.0;
        next_line._M_string_length._4_4_ = 0;
        next_line.field_2._M_allocated_capacity = 0;
        while (*local_378 != '\0') {
          local_288 = getUInt3(this,&local_378);
          std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::push_back
                    ((vector<embree::Vertex,_std::allocator<embree::Vertex>_> *)&next_line,
                     &local_288);
          parseSepOpt(&local_378);
        }
        std::
        vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
        ::push_back(this_02,(value_type *)&next_line);
        std::_Vector_base<embree::Vertex,_std::allocator<embree::Vertex>_>::~_Vector_base
                  ((_Vector_base<embree::Vertex,_std::allocator<embree::Vertex>_> *)&next_line);
        goto LAB_00137e98;
      }
    }
    else if (cVar12 == 'v') {
      cVar5 = pcVar17[1];
      if (cVar5 == '\t') {
LAB_001376a9:
        local_378 = pcVar17 + 2;
        getVec3f((embree *)&next_line,&local_378);
        fVar36 = (float)next_line._M_string_length;
        fVar32 = next_line._M_dataplus._M_p._4_4_;
        sVar26 = (this->v).size_active;
        uVar23 = (this->v).size_alloced;
        uVar29 = sVar26 + 1;
        uVar14 = (uint)next_line._M_dataplus._M_p;
        fVar31 = 0.0;
        if (uVar23 < uVar29) {
          uVar24 = uVar23;
          uVar30 = uVar29;
          if (uVar23 != 0) {
            for (; uVar30 = uVar24, uVar24 < uVar29; uVar24 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0))
            {
            }
          }
          if (uVar23 != uVar30) {
            local_338._0_16_ = ZEXT416((uint)next_line._M_dataplus._M_p);
            pVVar22 = (this->v).items;
            pVVar20 = (Vec3fa *)alignedMalloc(uVar30 << 4,0x10);
            (this->v).items = pVVar20;
            lVar21 = 0;
            for (uVar23 = 0; uVar23 < *local_310; uVar23 = uVar23 + 1) {
              puVar3 = (undefined8 *)((long)&pVVar22->field_0 + lVar21);
              uVar8 = puVar3[1];
              puVar4 = (undefined8 *)((long)&((this->v).items)->field_0 + lVar21);
              *puVar4 = *puVar3;
              puVar4[1] = uVar8;
              lVar21 = lVar21 + 0x10;
            }
            alignedFree(pVVar22);
            (this->v).size_active = sVar26;
            (this->v).size_alloced = uVar30;
            uVar14 = local_338._0_4_;
            fVar31 = (float)local_338._12_4_;
          }
        }
        pVVar22 = (this->v).items;
        (this->v).size_active = uVar29;
LAB_00137e88:
        pVVar22 = pVVar22 + sVar26;
        *(uint *)&pVVar22->field_0 = uVar14;
        (pVVar22->field_0).m128[1] = fVar32;
        (pVVar22->field_0).m128[2] = fVar36;
        (pVVar22->field_0).m128[3] = fVar31;
        goto LAB_00137e98;
      }
      if (cVar5 == 't') {
        if ((pcVar17[2] == ' ') || (pcVar17[2] == '\t')) {
          local_378 = pcVar17 + 3;
          fVar31 = getFloat(&local_378);
          local_338._0_4_ = fVar31;
          fVar31 = getFloat(&local_378);
          next_line._M_dataplus._M_p._0_4_ = local_338._0_4_;
          next_line._M_dataplus._M_p._4_4_ = fVar31;
          std::vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>>::
          emplace_back<embree::Vec2<float>>
                    ((vector<embree::Vec2<float>,std::allocator<embree::Vec2<float>>> *)this_00,
                     (Vec2<float> *)&next_line);
          goto LAB_00137e98;
        }
      }
      else if (cVar5 == 'n') {
        if ((pcVar17[2] == ' ') || (pcVar17[2] == '\t')) {
          local_378 = pcVar17 + 3;
          getVec3f((embree *)&next_line,&local_378);
          fVar36 = (float)next_line._M_string_length;
          fVar32 = next_line._M_dataplus._M_p._4_4_;
          sVar26 = (this->vn).size_active;
          uVar23 = (this->vn).size_alloced;
          uVar29 = sVar26 + 1;
          uVar14 = (uint)next_line._M_dataplus._M_p;
          fVar31 = 0.0;
          if (uVar23 < uVar29) {
            uVar24 = uVar23;
            uVar30 = uVar29;
            if (uVar23 != 0) {
              for (; uVar30 = uVar24, uVar24 < uVar29;
                  uVar24 = uVar24 * 2 + (ulong)(uVar24 * 2 == 0)) {
              }
            }
            if (uVar23 != uVar30) {
              local_338._0_16_ = ZEXT416((uint)next_line._M_dataplus._M_p);
              pVVar22 = (this->vn).items;
              pVVar20 = (Vec3fa *)alignedMalloc(uVar30 << 4,0x10);
              (this->vn).items = pVVar20;
              lVar21 = 0;
              for (uVar23 = 0; uVar23 < paVar10->size_active; uVar23 = uVar23 + 1) {
                puVar3 = (undefined8 *)((long)&pVVar22->field_0 + lVar21);
                uVar8 = puVar3[1];
                puVar4 = (undefined8 *)((long)&((this->vn).items)->field_0 + lVar21);
                *puVar4 = *puVar3;
                puVar4[1] = uVar8;
                lVar21 = lVar21 + 0x10;
              }
              alignedFree(pVVar22);
              (this->vn).size_active = sVar26;
              (this->vn).size_alloced = uVar30;
              uVar14 = local_338._0_4_;
              fVar31 = (float)local_338._12_4_;
            }
          }
          pVVar22 = (this->vn).items;
          (this->vn).size_active = uVar29;
          goto LAB_00137e88;
        }
      }
      else if (cVar5 == ' ') goto LAB_001376a9;
    }
    iVar13 = strncmp(pcVar17,"hair",4);
    if ((iVar13 == 0) && ((pcVar17[4] == ' ' || (pcVar17[4] == '\t')))) {
      local_378 = pcVar17 + 4;
      parseSep(&local_378);
      pcVar17 = local_378;
      iVar13 = strncmp(local_378,"plane",5);
      if (iVar13 == 0) {
        pcVar27 = pcVar17 + 5;
        if ((pcVar17[5] != '\t') && (pcVar17[5] != ' ')) goto LAB_0013799d;
LAB_00137afe:
        local_378 = pcVar27;
        parseSep(&local_378);
        uVar14 = getInt(&local_378);
        uVar29 = 0;
        next_line.field_2._M_allocated_capacity = 0;
        next_line.field_2._8_8_ = 0;
        for (iVar13 = 0; next_line._M_string_length = uVar29, iVar13 != uVar14 * 3 + 1;
            iVar13 = iVar13 + 1) {
          local_338._0_4_ = getFloat(&local_378);
          pcVar17 = local_378;
          local_338._4_4_ = extraout_XMM0_Db;
          local_338._8_4_ = extraout_XMM0_Dc;
          local_338._12_4_ = extraout_XMM0_Dd;
          sVar16 = strspn(local_378," \t");
          local_378 = pcVar17 + sVar16;
          fVar31 = (float)local_338._0_4_;
          uVar33 = local_338._4_4_;
          uVar34 = local_338._8_4_;
          uVar35 = local_338._12_4_;
          fVar32 = (float)local_338._0_4_;
          sVar9 = next_line._M_string_length;
          if (pcVar17[sVar16] != '\0') {
            fVar32 = getFloat(&local_378);
            fVar31 = getFloat(&local_378);
            uVar33 = extraout_XMM0_Db_00;
            uVar34 = extraout_XMM0_Dc_00;
            uVar35 = extraout_XMM0_Dd_00;
            sVar9 = next_line._M_string_length;
          }
          uVar8 = next_line.field_2._8_8_;
          uVar29 = sVar9 + 1;
          if (next_line.field_2._M_allocated_capacity < uVar29) {
            uVar28 = next_line.field_2._M_allocated_capacity;
            uVar23 = uVar29;
            if (next_line.field_2._M_allocated_capacity != 0) {
              for (; uVar23 = uVar28, (ulong)uVar28 < uVar29;
                  uVar28 = uVar28 * 2 + (ulong)(uVar28 * 2 == 0)) {
              }
            }
            if (next_line.field_2._M_allocated_capacity != uVar23) {
              local_268 = fVar31;
              uStack_264 = uVar33;
              uStack_260 = uVar34;
              uStack_25c = uVar35;
              next_line._M_string_length = sVar9;
              next_line.field_2._8_8_ = alignedMalloc(uVar23 << 4,0x10);
              lVar21 = 0;
              for (uVar24 = 0; uVar24 < next_line._M_string_length; uVar24 = uVar24 + 1) {
                puVar4 = (undefined8 *)(uVar8 + lVar21);
                uVar28 = puVar4[1];
                *(undefined8 *)(next_line.field_2._8_8_ + lVar21) = *puVar4;
                ((undefined8 *)(next_line.field_2._8_8_ + lVar21))[1] = uVar28;
                lVar21 = lVar21 + 0x10;
              }
              alignedFree((void *)uVar8);
              fVar31 = local_268;
              next_line.field_2._M_allocated_capacity = uVar23;
            }
          }
          auVar7._4_4_ = fVar32;
          auVar7._0_4_ = local_338._0_4_;
          auVar7._8_4_ = fVar31;
          auVar7._12_4_ = 0;
          *(undefined1 (*) [16])(next_line.field_2._8_8_ + sVar9 * 0x10) = auVar7;
          this = local_320;
        }
        for (uVar29 = 0; (ulong)(uVar14 + 1) * 3 != uVar29; uVar29 = uVar29 + 3) {
          fVar31 = getFloat(&local_378);
          local_338._0_4_ = fVar31;
          getInt(&local_378);
          if (uVar29 == 0) {
            uVar23 = 0;
          }
          else {
            *(undefined4 *)(next_line.field_2._8_8_ + 0xc + (ulong)((int)uVar29 - 1) * 0x10) =
                 local_338._0_4_;
            uVar23 = uVar29 & 0xffffffff;
          }
          *(undefined4 *)(next_line.field_2._8_8_ + 0xc + uVar23 * 0x10) = local_338._0_4_;
          if ((ulong)uVar14 * 3 != uVar29) {
            *(undefined4 *)(next_line.field_2._8_8_ + 0xc + (ulong)((int)uVar23 + 1) * 0x10) =
                 local_338._0_4_;
          }
        }
        std::
        vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
        ::push_back(this_03,(value_type *)&next_line);
        alignedFree((void *)next_line.field_2._8_8_);
        cVar12 = *local_378;
        pcVar17 = local_378;
        goto LAB_00137869;
      }
LAB_0013799d:
      iVar13 = strncmp(pcVar17,"cylinder",8);
      if (iVar13 == 0) {
        pcVar27 = pcVar17 + 8;
        if ((pcVar17[8] == ' ') || (pcVar17[8] == '\t')) goto LAB_00137afe;
      }
    }
    else {
LAB_00137869:
      __k = &next_line;
      if (((cVar12 == 'e') && (pcVar17[1] == 'c')) && ((pcVar17[2] == ' ' || (pcVar17[2] == '\t'))))
      {
        local_378 = pcVar17 + 2;
        parseSep(&local_378);
        fVar31 = getFloat(&local_378);
        local_338._0_4_ = fVar31;
        parseSepOpt(&local_378);
        iVar13 = getInt(&local_378);
        if (iVar13 < 1) {
          if (iVar13 == 0) {
            iVar13 = 0;
          }
          else {
            iVar13 = iVar13 + (int)*local_310;
          }
        }
        else {
          iVar13 = iVar13 + -1;
        }
        parseSepOpt(&local_378);
        iVar15 = getInt(&local_378);
        if (iVar15 < 1) {
          if (iVar15 == 0) {
            iVar15 = 0;
          }
          else {
            iVar15 = iVar15 + (int)*local_310;
          }
        }
        else {
          iVar15 = iVar15 + -1;
        }
        parseSepOpt(&local_378);
        next_line._M_dataplus._M_p._0_4_ = local_338._0_4_;
        next_line._M_dataplus._M_p._4_4_ = (float)iVar13;
        next_line._M_string_length._0_4_ = (float)iVar15;
        std::vector<embree::Crease,_std::allocator<embree::Crease>_>::emplace_back<embree::Crease>
                  (this_01,(Crease *)__k);
      }
      else {
        iVar13 = strncmp(pcVar17,"usemtl",6);
        if ((iVar13 == 0) && ((pcVar17[6] == ' ' || (pcVar17[6] == '\t')))) {
          if (!combineIntoSingleObject) {
            flushFaceGroup(this);
          }
          local_378 = pcVar17 + 6;
          pcVar17 = parseSep(&local_378);
          pOVar25 = local_370;
          std::__cxx11::string::string((string *)__k,pcVar17,(allocator *)&local_288);
          iVar18 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                   ::find(&this_04->_M_t,__k);
          if ((_Rb_tree_header *)iVar18._M_node == p_Var1) {
            (*(pOVar25->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount[2])(pOVar25);
            pMVar6 = (this->curMaterial).ptr;
            if (pMVar6 != (MaterialNode *)0x0) {
              (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            (this->curMaterial).ptr = &pOVar25->super_MaterialNode;
            std::__cxx11::string::assign((char *)local_318);
          }
          else {
            pmVar19 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                      ::operator[](this_04,__k);
            if (pmVar19->ptr != (MaterialNode *)0x0) {
              (*(pmVar19->ptr->super_Node).super_RefCount._vptr_RefCount[2])();
            }
            pMVar6 = (this->curMaterial).ptr;
            if (pMVar6 != (MaterialNode *)0x0) {
              (*(pMVar6->super_Node).super_RefCount._vptr_RefCount[3])();
            }
            (this->curMaterial).ptr = pmVar19->ptr;
            std::__cxx11::string::_M_assign(local_318);
          }
        }
        else {
          iVar13 = strncmp(pcVar17,"mtllib",6);
          if ((iVar13 != 0) || ((pcVar17[6] != ' ' && (pcVar17[6] != '\t')))) goto LAB_00137e98;
          local_378 = pcVar17 + 6;
          pcVar17 = parseSep(&local_378);
          std::__cxx11::string::string((string *)&local_288,pcVar17,&local_339);
          FileName::operator+((FileName *)__k,__return_storage_ptr__,(string *)&local_288);
          loadMTL(this,(FileName *)__k);
          std::__cxx11::string::~string((string *)__k);
          __k = (string *)&local_288;
        }
        std::__cxx11::string::~string((string *)__k);
      }
    }
LAB_00137e98:
    std::__cxx11::string::~string((string *)&line);
    pOVar25 = local_370;
  } while( true );
}

Assistant:

OBJLoader::OBJLoader(const FileName &fileName, const bool subdivMode, const bool combineIntoSingleObject) 
    : group(new SceneGraph::GroupNode), path(fileName.path()), subdivMode(subdivMode)
  {
    /* open file */
    std::ifstream cin;
    cin.open(fileName.c_str());
    if (!cin.is_open()) {
      THROW_RUNTIME_ERROR("cannot open " + fileName.str());
      return;
    }

    /* generate default material */
    Ref<SceneGraph::MaterialNode> defaultMaterial = new OBJMaterial("default");
    curMaterialName = "default";
    curMaterial = defaultMaterial;

    while (cin.peek() != -1)
    {
      /* load next multiline */
      std::string line; std::getline(cin,line);
      while (!line.empty() && line[line.size()-1] == '\\') {
	line[line.size()-1] = ' ';
	std::string next_line; std::getline(cin,next_line);
	if (next_line.empty()) break;
	line += next_line;
      }
      const char* token = trimEnd(line.c_str() + strspn(line.c_str(), " \t"));
      if (token[0] == 0) continue;

      /*! parse position */
      if (token[0] == 'v' && isSep(token[1])) { 
        v.push_back(getVec3f(token += 2)); continue;
      }

      /* parse normal */
      if (token[0] == 'v' && token[1] == 'n' && isSep(token[2])) { 
        vn.push_back(getVec3f(token += 3)); 
        continue; 
      }

      /* parse texcoord */
      if (token[0] == 'v' && token[1] == 't' && isSep(token[2])) { vt.push_back(getVec2f(token += 3)); continue; }

      /*! parse face */
      if (token[0] == 'f' && isSep(token[1]))
      {
        parseSep(token += 1);

        std::vector<Vertex> face;
        while (token[0]) {
	  Vertex vtx = getUInt3(token);
          face.push_back(vtx);
          parseSepOpt(token);
        }
        curGroup.push_back(face);
        continue;
      }

      /*! parse corona hair */
      if (!strncmp(token,"hair",4) && isSep(token[4]))
      {
        parseSep(token += 4);
        bool plane = !strncmp(token,"plane",5) && isSep(token[5]);
        if (plane) {
          parseSep(token += 5);
        }
        else if (!strncmp(token,"cylinder",8) && isSep(token[8])) {
          parseSep(token += 8);
        }
        else continue;

        unsigned int N = getInt(token);
        avector<Vec3ff> hair;
        for (unsigned int i=0; i<3*N+1; i++) {
          hair.push_back((Vec3ff)getVec3fa(token));
        }
        
        for (unsigned int i=0; i<N+1; i++)
        {
          float r = getFloat(token);
          MAYBE_UNUSED float t = (float)getInt(token);
          if (i != 0) hair[3*i-1].w = r;
          hair[3*i+0].w = r;
          if (i != N) hair[3*i+1].w = r;
        }
        curGroupHair.push_back(hair);
      }
      
      /*! parse edge crease */
      if (token[0] == 'e' && token[1] == 'c' && isSep(token[2]))
      {
	parseSep(token += 2);
	float w = getFloat(token);
	parseSepOpt(token);
	unsigned int a = fix_v(getInt(token));
	parseSepOpt(token);
	unsigned int b = fix_v(getInt(token));
	parseSepOpt(token);
	ec.push_back(Crease(w, a, b));
	continue;
      }

      /*! use material */
      if (!strncmp(token, "usemtl", 6) && isSep(token[6]))
      {
        if (!combineIntoSingleObject) flushFaceGroup();
        std::string name(parseSep(token += 6));
        if (material.find(name) == material.end()) {
          curMaterial = defaultMaterial;
          curMaterialName = "default";
        }
        else {
          curMaterial = material[name];
          curMaterialName = name;
        }
        continue;
      }

      /* load material library */
      if (!strncmp(token, "mtllib", 6) && isSep(token[6])) {
        loadMTL(path + std::string(parseSep(token += 6)));
        continue;
      }

      // ignore unknown stuff
    }
    flushFaceGroup();

    cin.close();
  }